

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O1

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
sum_function::evaluate
          (sum_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  pointer ppVar1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  bool bVar2;
  bool bVar3;
  iterator this_01;
  reference pbVar4;
  assertion_error *this_02;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j;
  double dVar5;
  const_array_range_type cVar6;
  double sum;
  string local_58;
  reference local_38;
  
  ppVar1 = (args->
           super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4 !=
      (this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value) {
    this_02 = (assertion_error *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"assertion \'args.size() == *this->arity()\' failed at  <> :0",""
              );
    assertion_error::assertion_error(this_02,&local_58);
    __cxa_throw(this_02,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (ppVar1->type_ == value) {
    this_00 = (ppVar1->field_1).value_;
    bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(this_00);
    if (bVar2) {
      local_58._M_dataplus._M_p = (pointer)0x0;
      cVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range(this_00)
      ;
      this_01 = cVar6.first_._M_current;
      do {
        bVar2 = this_01._M_current == cVar6.last_._M_current._M_current;
        if (bVar2) {
LAB_00385249:
          if (bVar2) {
            local_38 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                       ::create_json<double&>
                                 ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                                   *)context,(double *)&local_58);
          }
          return local_38;
        }
        bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                          (this_01._M_current);
        if (!bVar3) {
          std::error_code::operator=(ec,invalid_type);
          local_38 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     ::null_value(context);
          goto LAB_00385249;
        }
        dVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_double
                          (this_01._M_current);
        local_58._M_dataplus._M_p = (pointer)(dVar5 + local_58._M_dataplus._M_p);
        this_01._M_current = this_01._M_current + 1;
      } while( true );
    }
  }
  std::error_code::operator=(ec,invalid_type);
  pbVar4 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::null_value(context);
  return pbVar4;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!args[0].is_value())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                reference arg0 = args[0].value();
                if (!arg0.is_array())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }
                double sum = 0;
                for (auto& j : arg0.array_range())
                {
                    if (!j.is_number())
                    {
                        ec = jmespath_errc::invalid_type;
                        return context.null_value();
                    }
                    sum += j.template as<double>();
                }

                return *context.create_json(sum);
            }